

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ConstantExpressionRunner<wasm::CExpressionRunner>::visitGlobalGet
          (Flow *__return_storage_ptr__,ConstantExpressionRunner<wasm::CExpressionRunner> *this,
          GlobalGet *curr)

{
  Name breakTo;
  bool bVar1;
  Global *this_00;
  pointer ppVar2;
  _Node_iterator_base<std::pair<const_wasm::Name,_wasm::Literals>,_true> local_48;
  _Node_iterator_base<std::pair<const_wasm::Name,_wasm::Literals>,_true> local_40;
  iterator iter;
  Global *global;
  GlobalGet *curr_local;
  ConstantExpressionRunner<wasm::CExpressionRunner> *this_local;
  
  if ((this->super_ExpressionRunner<wasm::CExpressionRunner>).module != (Module *)0x0) {
    iter.super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Literals>,_true>._M_cur =
         (_Node_iterator_base<std::pair<const_wasm::Name,_wasm::Literals>,_true>)
         (curr->name).super_IString.str._M_len;
    this_00 = Module::getGlobal((this->super_ExpressionRunner<wasm::CExpressionRunner>).module,
                                (Name)(curr->name).super_IString.str);
    bVar1 = Importable::imported(&this_00->super_Importable);
    if ((!bVar1) && ((this_00->mutable_ & 1U) == 0)) {
      ExpressionRunner<wasm::CExpressionRunner>::visit
                (__return_storage_ptr__,&this->super_ExpressionRunner<wasm::CExpressionRunner>,
                 this_00->init);
      return __return_storage_ptr__;
    }
  }
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Name,_wasm::Literals,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
       ::find(&this->globalValues,&curr->name);
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Name,_wasm::Literals,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
       ::end(&this->globalValues);
  bVar1 = std::__detail::operator!=(&local_40,&local_48);
  if (bVar1) {
    ppVar2 = std::__detail::_Node_iterator<std::pair<const_wasm::Name,_wasm::Literals>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_wasm::Name,_wasm::Literals>,_false,_true>
                           *)&local_40);
    Flow::Flow(__return_storage_ptr__,&ppVar2->second);
  }
  else {
    breakTo.super_IString.str._M_str = DAT_027e5710;
    breakTo.super_IString.str._M_len = NONCONSTANT_FLOW;
    Flow::Flow(__return_storage_ptr__,breakTo);
  }
  return __return_storage_ptr__;
}

Assistant:

Flow visitGlobalGet(GlobalGet* curr) {
    NOTE_ENTER("GlobalGet");
    NOTE_NAME(curr->name);
    if (this->module != nullptr) {
      auto* global = this->module->getGlobal(curr->name);
      // Check if the global has an immutable value anyway
      if (!global->imported() && !global->mutable_) {
        return ExpressionRunner<SubType>::visit(global->init);
      }
    }
    // Check if a constant value has been set in the context of this runner.
    auto iter = globalValues.find(curr->name);
    if (iter != globalValues.end()) {
      return Flow(iter->second);
    }
    return Flow(NONCONSTANT_FLOW);
  }